

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O3

vec4 __thiscall vera::Triangle::getClosestRGBSignedDistance(Triangle *this,vec3 *_p)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar6;
  float fVar7;
  float fVar8;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar9;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar10;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar11;
  float fVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  vec3 vVar15;
  vec3 vVar16;
  vec4 vVar17;
  vec4 vVar18;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_78;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_74;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 local_58;
  vec3 local_38;
  vec3 local_28;
  
  vVar15 = getClosestPoint(this,_p);
  local_28._0_8_ = vVar15._0_8_;
  local_28.field_2 = vVar15.field_2;
  vVar16 = getBarycentricOf(this,&local_28);
  local_38.field_2 = vVar16.field_2;
  local_38._0_8_ = vVar16._0_8_;
  vVar17 = getColor(this,&local_38);
  aVar11 = vVar17.field_3;
  fVar4 = (_p->field_2).z - vVar15.field_2.z;
  uVar1 = _p->field_0;
  uVar2 = _p->field_1;
  local_78 = vVar15.field_0;
  aStack_74 = vVar15.field_1;
  fVar5 = (float)uVar1 - local_78.x;
  fVar7 = (float)uVar2 - aStack_74.y;
  fVar8 = fVar7 * fVar7;
  vVar15 = getNormal(this,&local_38);
  aVar10 = vVar15.field_2;
  aVar6 = vVar15.field_0;
  aVar9 = vVar15.field_1;
  auVar14._0_4_ = fVar4 * fVar4;
  auVar14._4_4_ = aVar10.z * aVar10.z;
  auVar14._8_4_ = 0;
  auVar14._12_4_ = aVar11.w * aVar11.w;
  auVar12._0_4_ = fVar8 + fVar5 * fVar5 + auVar14._0_4_;
  auVar12._4_4_ = aVar9.y * aVar9.y + aVar6.x * aVar6.x + auVar14._4_4_;
  auVar12._8_4_ = fVar8 + fVar8 + 0.0;
  auVar12._12_4_ = fVar8 + aVar9.y * aVar9.y + auVar14._12_4_;
  auVar14 = sqrtps(auVar14,auVar12);
  auVar12 = divps(_DAT_002dd4c0,auVar14);
  fVar8 = auVar12._0_4_;
  fVar13 = auVar12._4_4_;
  uVar3 = -(uint)(0.0 <= aVar10.z * fVar13 * fVar4 * fVar8 +
                         aVar9.y * fVar13 * fVar7 * fVar8 + fVar5 * fVar8 * aVar6.x * fVar13);
  local_58 = vVar17.field_2;
  vVar18.field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
       (~uVar3 & (auVar14._0_4_ ^ 0x80000000) | auVar14._0_4_ & uVar3);
  vVar18.field_2 = local_58;
  vVar18.field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(int)vVar17._0_8_
  ;
  vVar18.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
       (int)((ulong)vVar17._0_8_ >> 0x20);
  return vVar18;
}

Assistant:

glm::vec4 Triangle::getClosestRGBSignedDistance(const glm::vec3& _p) const {
    glm::vec3 nearest = glm::vec3(0.0);
    glm::vec3 pseudo_normal = getNormal();

    nearest = getClosestPoint(_p);

    glm::vec3 barycentric = getBarycentricOf(nearest);
    glm::vec4 c = getColor( barycentric );

    glm::vec3 u = _p - nearest;
    c.a = glm::length(u);
    // c.a = unsignedDistance(_p);

    pseudo_normal = getNormal( barycentric );

    c.a = (glm::dot( glm::normalize(u), glm::normalize(pseudo_normal) ) >= 0.0)? c.a : -c.a; 
    // c.a *= glm::sign( glm::dot(_p, m_normal) - glm::dot(m_vertices[0], m_normal) );

    return c;
}